

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heterogeneous_queue_basic_tests.cpp
# Opt level: O3

void density_tests::spinlocking_heterogeneous_queue_basic_tests(ostream *i_ostream)

{
  PrintScopeDuration dur;
  PrintScopeDuration PStack_38;
  
  PrintScopeDuration::PrintScopeDuration
            (&PStack_38,i_ostream,"spin-locking heterogeneous queue basic tests");
  SpQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1>::tests
            (i_ostream);
  SpQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>::tests
            (i_ostream);
  SpQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::tests
            (i_ostream);
  SpQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0>::tests
            (i_ostream);
  PrintScopeDuration::~PrintScopeDuration(&PStack_38);
  return;
}

Assistant:

void spinlocking_heterogeneous_queue_basic_tests(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "spin-locking heterogeneous queue basic tests");

        constexpr auto mult   = density::concurrency_multiple;
        constexpr auto single = density::concurrency_single;

        SpQueueBasicTests<mult, mult>::tests(i_ostream);
        SpQueueBasicTests<single, mult>::tests(i_ostream);
        SpQueueBasicTests<mult, single>::tests(i_ostream);
        SpQueueBasicTests<single, single>::tests(i_ostream);
    }